

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>::
replace_result(storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag> *this,
              int id,bit_array *x,double value,double duration,size_t hash,long loop,
              int remaining_constraints)

{
  pointer prVar1;
  m_indices_reader lock;
  shared_lock<std::shared_mutex> local_40;
  
  local_40._M_owns = true;
  local_40._M_pm = &this->m_indices_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  bit_array_impl::operator=
            ((bit_array_impl *)
             ((this->m_data).
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start + id),&x->super_bit_array_impl);
  prVar1 = (this->m_data).
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar1[id].value = value;
  prVar1[id].duration = duration;
  prVar1[id].hash = hash;
  prVar1[id].loop = loop;
  prVar1[id].remaining_constraints = remaining_constraints;
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_40);
  return;
}

Assistant:

void replace_result(const int id,
                        const bit_array& x,
                        const double value,
                        const double duration,
                        const std::size_t hash,
                        const long int loop,
                        const int remaining_constraints) noexcept
    {
        m_indices_reader lock{ m_indices_mutex };

        m_data[id].x = x;
        m_data[id].value = value;
        m_data[id].duration = duration;
        m_data[id].hash = hash;
        m_data[id].loop = loop;
        m_data[id].remaining_constraints = remaining_constraints;
    }